

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O0

void __thiscall
duckdb::ColumnReader::
PlainTemplatedInternal<short,duckdb::DecimalParquetValueConversion<short,true>,false,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  short sVar1;
  short *psVar2;
  idx_t iVar3;
  size_t __n;
  ColumnReader *reader;
  long in_RCX;
  ByteBuffer *in_RSI;
  ulong in_R8;
  idx_t row_idx;
  ValidityMask *result_mask;
  idx_t copy_count;
  short *result_ptr;
  ulong local_50;
  ByteBuffer *in_stack_ffffffffffffffc0;
  
  psVar2 = FlatVector::GetData<short>((Vector *)0x2282526);
  iVar3 = DecimalParquetValueConversion<short,_true>::PlainConstantSize();
  if (iVar3 == 2) {
    iVar3 = DecimalParquetValueConversion<short,_true>::PlainConstantSize();
    __n = in_RCX * iVar3;
    memcpy(psVar2 + in_R8,in_RSI->ptr,__n);
    ByteBuffer::unsafe_inc(in_RSI,__n);
  }
  else {
    reader = (ColumnReader *)FlatVector::Validity((Vector *)0x2282593);
    for (local_50 = in_R8; local_50 < in_R8 + in_RCX; local_50 = local_50 + 1) {
      sVar1 = DecimalParquetValueConversion<short,_true>::PlainRead<false>
                        (in_stack_ffffffffffffffc0,reader);
      psVar2[local_50] = sVar1;
    }
  }
  return;
}

Assistant:

void PlainTemplatedInternal(ByteBuffer &plain_data, const uint8_t *__restrict defines, const uint64_t num_values,
	                            const idx_t result_offset, Vector &result) {
		const auto result_ptr = FlatVector::GetData<VALUE_TYPE>(result);
		if (!HAS_DEFINES && !CHECKED && CONVERSION::PlainConstantSize() == sizeof(VALUE_TYPE)) {
			// we can memcpy
			idx_t copy_count = num_values * CONVERSION::PlainConstantSize();
			memcpy(result_ptr + result_offset, plain_data.ptr, copy_count);
			plain_data.unsafe_inc(copy_count);
			return;
		}
		auto &result_mask = FlatVector::Validity(result);
		for (idx_t row_idx = result_offset; row_idx < result_offset + num_values; row_idx++) {
			if (HAS_DEFINES && defines[row_idx] != MaxDefine()) {
				result_mask.SetInvalid(row_idx);
				continue;
			}
			result_ptr[row_idx] = CONVERSION::template PlainRead<CHECKED>(plain_data, *this);
		}
	}